

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf.c
# Opt level: O2

int read_line_header_format_entries
              (backtrace_state *state,dwarf_data *ddata,unit *u,dwarf_buf *hdr_buf,line_header *hdr,
              size_t *pcount,char ***ppaths)

{
  byte bVar1;
  int iVar2;
  void *p;
  uint64_t uVar3;
  char **ppcVar4;
  char *__dest;
  line_header *plVar5;
  char *pcVar6;
  ulong uVar7;
  attr_val local_b0;
  size_t local_a0;
  size_t local_98;
  char *local_90;
  char *path;
  uint64_t *local_80;
  uint64_t local_78;
  char **local_70;
  char *local_68;
  dwarf_data *local_60;
  char *local_58;
  size_t local_50;
  uint64_t local_48;
  backtrace_state *local_40;
  line_header *local_38;
  
  local_80 = pcount;
  local_60 = ddata;
  local_38 = hdr;
  bVar1 = read_byte(hdr_buf);
  local_40 = state;
  if (bVar1 == 0) {
    p = (void *)0x0;
  }
  else {
    p = tcmalloc_backtrace_alloc
                  (state,(ulong)((uint)bVar1 * 8),hdr_buf->error_callback,hdr_buf->data);
    if (p == (void *)0x0) {
      return 0;
    }
    for (uVar7 = 0; bVar1 != uVar7; uVar7 = uVar7 + 1) {
      uVar3 = read_uleb128(hdr_buf);
      *(int *)((long)p + uVar7 * 8) = (int)uVar3;
      uVar3 = read_uleb128(hdr_buf);
      *(int *)((long)p + uVar7 * 8 + 4) = (int)uVar3;
    }
  }
  uVar3 = read_uleb128(hdr_buf);
  if (uVar3 == 0) {
    *local_80 = 0;
    *ppaths = (char **)0x0;
  }
  else {
    local_a0 = uVar3 * 8;
    local_78 = uVar3;
    ppcVar4 = (char **)tcmalloc_backtrace_alloc
                                 (local_40,local_a0,hdr_buf->error_callback,hdr_buf->data);
    if (ppcVar4 == (char **)0x0) {
LAB_0012fb80:
      iVar2 = 0;
      goto LAB_0012fb83;
    }
    path = (char *)&local_60->dwarf_sections;
    uVar3 = 0;
    plVar5 = local_38;
    local_70 = ppcVar4;
    while (uVar3 != local_78) {
      local_90 = (char *)0x0;
      local_58 = (char *)0x0;
      local_48 = uVar3;
      for (uVar7 = 0; pcVar6 = local_90, bVar1 != uVar7; uVar7 = uVar7 + 1) {
        iVar2 = read_attribute(*(dwarf_form *)((long)p + uVar7 * 8 + 4),0,hdr_buf,u->is_dwarf64,
                               u->version,plVar5->addrsize,(dwarf_sections *)path,local_60->altlink,
                               &local_b0);
        if (iVar2 == 0) goto LAB_0012fb64;
        iVar2 = *(int *)((long)p + uVar7 * 8);
        if (iVar2 == 1) {
          iVar2 = resolve_string((dwarf_sections *)path,u->is_dwarf64,local_60->is_bigendian,
                                 u->str_offsets_base,&local_b0,hdr_buf->error_callback,hdr_buf->data
                                 ,&local_90);
          if (iVar2 == 0) goto LAB_0012fb64;
        }
        else if ((iVar2 == 2) && (local_b0.encoding == ATTR_VAL_UINT)) {
          if (local_38->dirs_count <= local_b0.u.uint) {
            pcVar6 = "invalid directory index in line number program header";
            goto LAB_0012fb5a;
          }
          local_58 = local_38->dirs[local_b0.u.uint];
        }
        plVar5 = local_38;
      }
      if (local_90 == (char *)0x0) {
        pcVar6 = "missing file name in line number program header";
LAB_0012fb5a:
        dwarf_buf_error(hdr_buf,pcVar6,0);
LAB_0012fb64:
        tcmalloc_backtrace_free(local_40,local_70,local_a0,hdr_buf->error_callback,hdr_buf->data);
        goto LAB_0012fb80;
      }
      if (local_58 != (char *)0x0) {
        local_50 = strlen(local_58);
        local_98 = strlen(pcVar6);
        __dest = (char *)tcmalloc_backtrace_alloc
                                   (local_40,local_50 + local_98 + 2,hdr_buf->error_callback,
                                    hdr_buf->data);
        if (__dest == (char *)0x0) goto LAB_0012fb64;
        local_68 = __dest;
        memcpy(__dest,local_58,local_50);
        local_68[local_50] = '/';
        memcpy(local_68 + local_50 + 1,pcVar6,local_98 + 1);
        plVar5 = local_38;
        pcVar6 = local_68;
      }
      local_70[local_48] = pcVar6;
      uVar3 = local_48 + 1;
    }
    *local_80 = local_78;
    *ppaths = local_70;
  }
  iVar2 = 1;
LAB_0012fb83:
  if (p != (void *)0x0) {
    tcmalloc_backtrace_free
              (local_40,p,(ulong)((uint)bVar1 * 8),hdr_buf->error_callback,hdr_buf->data);
  }
  return iVar2;
}

Assistant:

static int
read_line_header_format_entries (struct backtrace_state *state,
				 struct dwarf_data *ddata,
				 struct unit *u,
				 struct dwarf_buf *hdr_buf,
				 struct line_header *hdr,
				 size_t *pcount,
				 const char ***ppaths)
{
  size_t formats_count;
  struct line_header_format *formats;
  size_t paths_count;
  const char **paths;
  size_t i;
  int ret;

  formats_count = read_byte (hdr_buf);
  if (formats_count == 0)
    formats = NULL;
  else
    {
      formats = ((struct line_header_format *)
		 backtrace_alloc (state,
				  (formats_count
				   * sizeof (struct line_header_format)),
				  hdr_buf->error_callback,
				  hdr_buf->data));
      if (formats == NULL)
	return 0;

      for (i = 0; i < formats_count; i++)
	{
	  formats[i].lnct = (int) read_uleb128(hdr_buf);
	  formats[i].form = (enum dwarf_form) read_uleb128 (hdr_buf);
	}
    }

  paths_count = read_uleb128 (hdr_buf);
  if (paths_count == 0)
    {
      *pcount = 0;
      *ppaths = NULL;
      ret = 1;
      goto exit;
    }

  paths = ((const char **)
	   backtrace_alloc (state, paths_count * sizeof (const char *),
			    hdr_buf->error_callback, hdr_buf->data));
  if (paths == NULL)
    {
      ret = 0;
      goto exit;
    }
  for (i = 0; i < paths_count; i++)
    {
      if (!read_lnct (state, ddata, u, hdr_buf, hdr, formats_count,
		      formats, &paths[i]))
	{
	  backtrace_free (state, paths,
			  paths_count * sizeof (const char *),
			  hdr_buf->error_callback, hdr_buf->data);
	  ret = 0;
	  goto exit;
	}
    }

  *pcount = paths_count;
  *ppaths = paths;

  ret = 1;

 exit:
  if (formats != NULL)
    backtrace_free (state, formats,
		    formats_count * sizeof (struct line_header_format),
		    hdr_buf->error_callback, hdr_buf->data);

  return  ret;
}